

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteString
               (int field_number,string *value,CodedOutputStream *output)

{
  ulong uVar1;
  pointer data;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  LogMessage *other;
  ulong uVar6;
  uint8 *puVar7;
  int size;
  uint uVar8;
  size_t __n;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar8 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar7;
  }
  pbVar4 = output->cur_;
  if (uVar8 < 0x80) {
    *pbVar4 = (byte)uVar8 | 2;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar8 | 0x82;
    if (uVar8 < 0x4000) {
      pbVar4[1] = (byte)(uVar8 >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar8 = uVar8 >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar8 | 0x80;
        uVar3 = uVar8 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar3;
      } while (bVar2);
      *pbVar5 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar4;
  if ((value->_M_string_length & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1e2);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  uVar1 = value->_M_string_length;
  if ((output->impl_).end_ <= output->cur_) {
    puVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar7;
  }
  pbVar4 = output->cur_;
  if ((uint)uVar1 < 0x80) {
    *pbVar4 = (byte)uVar1;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar1 | 0x80;
    uVar6 = uVar1 >> 7 & 0x1ffffff;
    if ((uint)uVar1 < 0x4000) {
      pbVar4[1] = (byte)uVar6;
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      do {
        pbVar5 = pbVar4;
        uVar8 = (uint)uVar6;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar3 = uVar8 >> 7;
        uVar6 = (ulong)uVar3;
        pbVar4 = pbVar5 + 1;
      } while (0x3fff < uVar8);
      *pbVar5 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar4;
  data = (value->_M_dataplus)._M_p;
  size = (int)value->_M_string_length;
  __n = (size_t)size;
  if ((long)(output->impl_).end_ - (long)pbVar4 < (long)__n) {
    pbVar4 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,size,pbVar4);
  }
  else {
    memcpy(pbVar4,data,__n);
    pbVar4 = pbVar4 + __n;
  }
  output->cur_ = pbVar4;
  return;
}

Assistant:

void WireFormatLite::WriteString(int field_number, const std::string& value,
                                 io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}